

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int c_itoa(char *buf,size_t buf_size,int64_t num,int base,int flags,int field_width)

{
  char cVar1;
  int rem;
  int neg;
  int k;
  int i;
  char tmp [40];
  int field_width_local;
  int flags_local;
  int base_local;
  int64_t num_local;
  size_t buf_size_local;
  char *buf_local;
  
  neg = 0;
  rem = 0;
  tmp._36_4_ = field_width;
  _flags_local = num;
  if (num < 0) {
    _flags_local = -num;
  }
  do {
    cVar1 = (char)(_flags_local % (long)base);
    if ((int)(_flags_local % (long)base) < 10) {
      *(char *)((long)&k + (long)rem) = cVar1 + '0';
    }
    else {
      *(char *)((long)&k + (long)rem) = cVar1 + 'W';
    }
    rem = rem + 1;
    _flags_local = _flags_local / (long)base;
  } while (0 < _flags_local);
  if (flags != 0) {
    while (rem < (int)tmp._36_4_ && rem < 0x27) {
      *(undefined1 *)((long)&k + (long)rem) = 0x30;
      rem = rem + 1;
    }
  }
  if (num < 0) {
    *(undefined1 *)((long)&k + (long)rem) = 0x2d;
    rem = rem + 1;
  }
  while (rem = rem + -1, -1 < rem) {
    if (neg < (int)buf_size) {
      buf[neg] = *(char *)((long)&k + (long)rem);
    }
    neg = neg + 1;
  }
  return neg;
}

Assistant:

static int c_itoa(char *buf, size_t buf_size, int64_t num, int base, int flags,
                  int field_width) {
    char tmp[40];
    int i = 0, k = 0, neg = 0;

    if (num < 0) {
        neg++;
        num = -num;
    }

    /* Print into temporary buffer - in reverse order */
    do {
        int rem = num % base;
        if (rem < 10) {
            tmp[k++] = '0' + rem;
        } else {
            tmp[k++] = 'a' + (rem - 10);
        }
        num /= base;
    } while (num > 0);

    /* Zero padding */
    if (flags && C_SNPRINTF_FLAG_ZERO) {
        while (k < field_width && k < (int) sizeof(tmp) - 1) {
            tmp[k++] = '0';
        }
    }

    /* And sign */
    if (neg) {
        tmp[k++] = '-';
    }

    /* Now output */
    while (--k >= 0) {
        C_SNPRINTF_APPEND_CHAR(tmp[k]);
    }

    return i;
}